

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O1

Decoration
anon_unknown.dwarf_deef1e::TranslateLayoutDecoration(TType *type,TLayoutMatrix matrixLayout)

{
  uint uVar1;
  ulong uVar2;
  byte bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Decoration DVar5;
  Decoration DVar6;
  
  iVar4 = (*type->_vptr_TType[0x1c])();
  if ((char)iVar4 == '\0') {
    iVar4 = (*type->_vptr_TType[7])(type);
    DVar6 = DecorationMax;
    if (iVar4 == 0x10) {
      iVar4 = (*type->_vptr_TType[0xb])(type);
      uVar1 = *(uint *)(CONCAT44(extraout_var,iVar4) + 8);
      if (0xe < (uVar1 & 0x7f)) {
LAB_003bd81e:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                      ,0x1d4,
                      "spv::Decoration (anonymous namespace)::TranslateLayoutDecoration(const glslang::TType &, glslang::TLayoutMatrix)"
                     );
      }
      if ((0x7e00U >> (uVar1 & 0x1f) & 1) == 0) {
        if ((0xe0U >> (uVar1 & 0x1f) & 1) == 0) {
          if ((0x18U >> (uVar1 & 0x1f) & 1) == 0) goto LAB_003bd81e;
          iVar4 = (*type->_vptr_TType[0xb])(type);
          uVar2 = *(ulong *)(CONCAT44(extraout_var_01,iVar4) + 8);
          iVar4 = (*type->_vptr_TType[0xb])(type);
          bVar3 = *(byte *)(CONCAT44(extraout_var_02,iVar4) + 0x10) & 0xf;
          if ((uVar2 >> 0x2b & 1) == 0) {
            if (bVar3 == 0) {
              return DecorationMax;
            }
            __assert_fail("type.getQualifier().layoutPacking == glslang::ElpNone",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                          ,0x1c9,
                          "spv::Decoration (anonymous namespace)::TranslateLayoutDecoration(const glslang::TType &, glslang::TLayoutMatrix)"
                         );
          }
        }
        else {
          iVar4 = (*type->_vptr_TType[0xb])(type);
          bVar3 = *(byte *)(CONCAT44(extraout_var_00,iVar4) + 0x10) & 0xf;
        }
        DVar5 = DecorationMax;
        if (bVar3 == 4) {
          DVar5 = DecorationGLSLPacked;
        }
        DVar6 = DecorationGLSLShared;
        if (bVar3 != 1) {
          DVar6 = DVar5;
        }
      }
    }
  }
  else {
    DVar5 = DecorationMax;
    if (matrixLayout == ElmColumnMajor) {
      DVar5 = ColMajor;
    }
    DVar6 = DecorationRowMajor;
    if (matrixLayout != ElmRowMajor) {
      DVar6 = DVar5;
    }
  }
  return DVar6;
}

Assistant:

spv::Decoration TranslateLayoutDecoration(const glslang::TType& type, glslang::TLayoutMatrix matrixLayout)
{
    if (type.isMatrix()) {
        switch (matrixLayout) {
        case glslang::ElmRowMajor:
            return spv::DecorationRowMajor;
        case glslang::ElmColumnMajor:
            return spv::DecorationColMajor;
        default:
            // opaque layouts don't need a majorness
            return spv::DecorationMax;
        }
    } else {
        switch (type.getBasicType()) {
        default:
            return spv::DecorationMax;
            break;
        case glslang::EbtBlock:
            switch (type.getQualifier().storage) {
            case glslang::EvqShared:
            case glslang::EvqUniform:
            case glslang::EvqBuffer:
                switch (type.getQualifier().layoutPacking) {
                case glslang::ElpShared:  return spv::DecorationGLSLShared;
                case glslang::ElpPacked:  return spv::DecorationGLSLPacked;
                default:
                    return spv::DecorationMax;
                }
            case glslang::EvqVaryingIn:
            case glslang::EvqVaryingOut:
                if (type.getQualifier().isTaskMemory()) {
                    switch (type.getQualifier().layoutPacking) {
                    case glslang::ElpShared:  return spv::DecorationGLSLShared;
                    case glslang::ElpPacked:  return spv::DecorationGLSLPacked;
                    default: break;
                    }
                } else {
                    assert(type.getQualifier().layoutPacking == glslang::ElpNone);
                }
                return spv::DecorationMax;
            case glslang::EvqPayload:
            case glslang::EvqPayloadIn:
            case glslang::EvqHitAttr:
            case glslang::EvqCallableData:
            case glslang::EvqCallableDataIn:
            case glslang::EvqHitObjectAttrNV:
                return spv::DecorationMax;
            default:
                assert(0);
                return spv::DecorationMax;
            }
        }
    }
}